

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O0

uint16_t phys_section_add(uc_struct_conflict15 *uc,PhysPageMap *map,MemoryRegionSection *section)

{
  uint uVar1;
  MemoryRegionSection *pMVar2;
  uint local_24;
  MemoryRegionSection *section_local;
  PhysPageMap *map_local;
  uc_struct_conflict15 *uc_local;
  
  if (map->sections_nb < 0x4000) {
    if (map->sections_nb == map->sections_nb_alloc) {
      if (map->sections_nb_alloc << 1 < 0x11) {
        local_24 = 0x10;
      }
      else {
        local_24 = map->sections_nb_alloc << 1;
      }
      map->sections_nb_alloc = local_24;
      pMVar2 = (MemoryRegionSection *)g_realloc_n(map->sections,(ulong)map->sections_nb_alloc,0x40);
      map->sections = pMVar2;
    }
    memcpy(map->sections + map->sections_nb,section,0x40);
    uVar1 = map->sections_nb;
    map->sections_nb = uVar1 + 1;
    return (uint16_t)uVar1;
  }
  __assert_fail("map->sections_nb < TARGET_PAGE_SIZE",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/exec.c"
                ,0x345,
                "uint16_t phys_section_add(struct uc_struct *, PhysPageMap *, MemoryRegionSection *)"
               );
}

Assistant:

static uint16_t phys_section_add(struct uc_struct *uc, PhysPageMap *map,
                                 MemoryRegionSection *section)
{
    /* The physical section number is ORed with a page-aligned
     * pointer to produce the iotlb entries.  Thus it should
     * never overflow into the page-aligned value.
     */
    assert(map->sections_nb < TARGET_PAGE_SIZE);

    if (map->sections_nb == map->sections_nb_alloc) {
        map->sections_nb_alloc = MAX(map->sections_nb_alloc * 2, 16);
        map->sections = g_renew(MemoryRegionSection, map->sections,
                                map->sections_nb_alloc);
    }
    map->sections[map->sections_nb] = *section;
    return map->sections_nb++;
}